

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLMatrix33.cpp
# Opt level: O1

Matrix33 * AML::diag(Vector3 *rhs)

{
  double dVar1;
  double dVar2;
  Matrix33 *in_RDI;
  
  dVar1 = (rhs->field_0).data[1];
  dVar2 = (rhs->field_0).data[2];
  (in_RDI->field_0).data[0][0] = (rhs->field_0).data[0];
  (in_RDI->field_0).data[0][1] = 0.0;
  (in_RDI->field_0).data[0][2] = 0.0;
  (in_RDI->field_0).data[1][0] = 0.0;
  (in_RDI->field_0).data[1][1] = dVar1;
  (in_RDI->field_0).data[1][2] = 0.0;
  (in_RDI->field_0).data[2][0] = 0.0;
  (in_RDI->field_0).data[2][1] = 0.0;
  (in_RDI->field_0).data[2][2] = dVar2;
  return in_RDI;
}

Assistant:

Matrix33 diag(const Vector3& rhs)
    {
        double data[3][3];
        data[0][0] = rhs.x;
        data[0][1] = 0.0;
        data[0][2] = 0.0;
        data[1][0] = 0.0;
        data[1][1] = rhs.y;
        data[1][2] = 0.0;
        data[2][0] = 0.0;
        data[2][1] = 0.0;
        data[2][2] = rhs.z;
        return Matrix33(data);
    }